

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

int32_t icu_63::Normalizer2Impl::combine(uint16_t *list,UChar32 trail)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (trail < 0x3400) {
    uVar4 = trail * 2 & 0xffff;
    while( true ) {
      uVar1 = *list;
      if (uVar4 <= uVar1) break;
      list = list + (ulong)(uVar1 & 1) + 2;
    }
    if (uVar4 == (uVar1 & 0x7ffe)) {
      if ((uVar1 & 1) == 0) {
        return (uint)list[1];
      }
      return CONCAT22(list[1],list[2]);
    }
  }
  else {
    uVar4 = ((uint)trail >> 9) + 0x3400 & 0xfffe;
    uVar6 = (trail & 0x3ffU) << 6;
    while( true ) {
      while( true ) {
        uVar1 = *list;
        if (uVar4 <= uVar1) break;
        list = list + (ulong)(uVar1 & 1) + 2;
      }
      uVar5 = uVar1 & 0x7ffe;
      bVar3 = true;
      if (uVar4 != uVar5) goto LAB_002a23be;
      uVar2 = list[1];
      if (uVar6 <= uVar2) break;
      if ((short)uVar1 < 0) goto LAB_002a23be;
      list = list + 3;
    }
    if (uVar6 == (uVar2 & 0xffffffc0)) {
      uVar5 = (uint)list[2] | (uVar2 & 0x3f) << 0x10;
      bVar3 = false;
    }
LAB_002a23be:
    if (!bVar3) {
      return uVar5;
    }
  }
  return -1;
}

Assistant:

int32_t Normalizer2Impl::combine(const uint16_t *list, UChar32 trail) {
    uint16_t key1, firstUnit;
    if(trail<COMP_1_TRAIL_LIMIT) {
        // trail character is 0..33FF
        // result entry may have 2 or 3 units
        key1=(uint16_t)(trail<<1);
        while(key1>(firstUnit=*list)) {
            list+=2+(firstUnit&COMP_1_TRIPLE);
        }
        if(key1==(firstUnit&COMP_1_TRAIL_MASK)) {
            if(firstUnit&COMP_1_TRIPLE) {
                return ((int32_t)list[1]<<16)|list[2];
            } else {
                return list[1];
            }
        }
    } else {
        // trail character is 3400..10FFFF
        // result entry has 3 units
        key1=(uint16_t)(COMP_1_TRAIL_LIMIT+
                        (((trail>>COMP_1_TRAIL_SHIFT))&
                          ~COMP_1_TRIPLE));
        uint16_t key2=(uint16_t)(trail<<COMP_2_TRAIL_SHIFT);
        uint16_t secondUnit;
        for(;;) {
            if(key1>(firstUnit=*list)) {
                list+=2+(firstUnit&COMP_1_TRIPLE);
            } else if(key1==(firstUnit&COMP_1_TRAIL_MASK)) {
                if(key2>(secondUnit=list[1])) {
                    if(firstUnit&COMP_1_LAST_TUPLE) {
                        break;
                    } else {
                        list+=3;
                    }
                } else if(key2==(secondUnit&COMP_2_TRAIL_MASK)) {
                    return ((int32_t)(secondUnit&~COMP_2_TRAIL_MASK)<<16)|list[2];
                } else {
                    break;
                }
            } else {
                break;
            }
        }
    }
    return -1;
}